

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdUtils.c
# Opt level: O2

void CmdPrintTable(st__table *tTable,int fAliases)

{
  int iVar1;
  void *__base;
  st__generator *gen;
  Abc_Frame_t *pAbc;
  size_t sVar2;
  size_t __nmemb;
  char *value;
  int local_3c;
  char *key;
  
  local_3c = fAliases;
  __base = malloc((long)tTable->num_entries << 3);
  gen = st__init_gen(tTable);
  __nmemb = 0;
  while( true ) {
    iVar1 = st__gen(gen,&key,&value);
    if (iVar1 == 0) break;
    *(char **)((long)__base + __nmemb * 8) = key;
    __nmemb = __nmemb + 1;
  }
  st__free_gen(gen);
  qsort(__base,__nmemb,8,CmdNamePrintCompare);
  for (sVar2 = 0; __nmemb != sVar2; sVar2 = sVar2 + 1) {
    st__lookup(tTable,*(char **)((long)__base + sVar2 * 8),&value);
    if (local_3c == 0) {
      fprintf(_stdout,"%-15s %-15s\n",*(undefined8 *)((long)__base + sVar2 * 8),value);
    }
    else {
      pAbc = Abc_FrameGetGlobalFrame();
      CmdCommandAliasPrint(pAbc,(Abc_Alias *)value);
    }
  }
  free(__base);
  return;
}

Assistant:

void CmdPrintTable( st__table * tTable, int fAliases )
{
    st__generator * gen;
    const char ** ppNames;
    const char * key;
    char* value;
    int nNames, i;

    // collect keys in the array
    ppNames = ABC_ALLOC( const char *, st__count(tTable) );
    nNames = 0;
    st__foreach_item( tTable, gen, &key, &value )
        ppNames[nNames++] = key;

    // sort array by name
    qsort( (void *)ppNames, (size_t)nNames, sizeof(char *), 
        (int (*)(const void *, const void *))CmdNamePrintCompare );

    // print in this order
    for ( i = 0; i < nNames; i++ )
    {
        st__lookup( tTable, ppNames[i], &value );
        if ( fAliases )
            CmdCommandAliasPrint( Abc_FrameGetGlobalFrame(), (Abc_Alias *)value );
        else
            fprintf( stdout, "%-15s %-15s\n", ppNames[i], value );
    }
    ABC_FREE( ppNames );
}